

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

ResendRequest *
anon_unknown.dwarf_2926b4::createResendRequest
          (ResendRequest *__return_storage_ptr__,char *sender,char *target,int seq,int begin,int end
          )

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_1a0;
  FieldBase local_148;
  EndSeqNo local_f0;
  BeginSeqNo local_88;
  undefined1 local_2d;
  int local_2c;
  int local_28;
  int end_local;
  int begin_local;
  int seq_local;
  char *target_local;
  char *sender_local;
  ResendRequest *resendRequest;
  
  local_2d = 0;
  local_2c = end;
  local_28 = begin;
  end_local = seq;
  _begin_local = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  FIX42::ResendRequest::ResendRequest(__return_storage_ptr__);
  FIX::BeginSeqNo::BeginSeqNo(&local_88,(long)local_28);
  FIX42::ResendRequest::set(__return_storage_ptr__,&local_88);
  FIX::BeginSeqNo::~BeginSeqNo(&local_88);
  FIX::EndSeqNo::EndSeqNo(&local_f0,(long)local_2c);
  FIX42::ResendRequest::set(__return_storage_ptr__,&local_f0);
  FIX::EndSeqNo::~EndSeqNo(&local_f0);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,_begin_local,end_local);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_148,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_148,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_148);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_1a0,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_1a0,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

FIX42::ResendRequest createResendRequest(const char *sender, const char *target, int seq, int begin, int end) {
  FIX42::ResendRequest resendRequest;
  resendRequest.set(BeginSeqNo(begin));
  resendRequest.set(EndSeqNo(end));
  fillHeader(resendRequest.getHeader(), sender, target, seq);
  resendRequest.getHeader().setField(BodyLength(resendRequest.bodyLength()));
  resendRequest.getTrailer().setField(CheckSum(resendRequest.checkSum()));
  return resendRequest;
}